

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_list_item_count(AMQP_VALUE value,uint32_t *size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || size == (uint32_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x551;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_list_item_count",0x550,1,"Bad arguments: value = %p, size = %p",
                value,size);
    }
  }
  else if (value->type == AMQP_TYPE_LIST) {
    *size = (value->value).binary_value.length;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x55b;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_list_item_count",0x55a,1,"Value is not of type LIST");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_list_item_count(AMQP_VALUE value, uint32_t* size)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_159: [If any of the arguments are NULL, amqpvalue_get_list_item_count shall return a non-zero value.] */
    if ((value == NULL) ||
        (size == NULL))
    {
        LogError("Bad arguments: value = %p, size = %p",
            value, size);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        /* Codes_SRS_AMQPVALUE_01_160: [If the AMQP_VALUE is not a list then amqpvalue_get_list_item_count shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_LIST)
        {
            LogError("Value is not of type LIST");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_157: [amqpvalue_get_list_item_count shall fill in the size argument the number of items held by the AMQP list.] */
            *size = value_data->value.list_value.count;

            /* Codes_SRS_AMQPVALUE_01_158: [On success amqpvalue_get_list_item_count shall return 0.] */
            result = 0;
        }
    }

    return result;
}